

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_JoinerDisable_Test::~InterpreterTestSuite_PC_JoinerDisable_Test
          (InterpreterTestSuite_PC_JoinerDisable_Test *this)

{
  InterpreterTestSuite_PC_JoinerDisable_Test *this_local;
  
  ~InterpreterTestSuite_PC_JoinerDisable_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_JoinerDisable)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, DisableJoiner(JoinerType::kNMKP, 1)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("joiner disable nmkp 1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}